

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O3

Token * next(Token *__return_storage_ptr__,vector<Token,_std::allocator<Token>_> *input,int index)

{
  ulong uVar1;
  pointer pTVar2;
  _Alloc_hider _Var3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  vector<Token,_std::allocator<Token>_> local_38;
  
  std::vector<Token,_std::allocator<Token>_>::vector(&local_38,input);
  uVar4 = (ulong)index;
  lVar6 = ((long)local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar1 = lVar6 - 1;
  local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_start = local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start + uVar4;
  do {
    local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_start = local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
    uVar4 = uVar4 + 1;
    if ((local_38.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_start)->type != EOL) break;
  } while (uVar4 < uVar1);
  iVar5 = (int)lVar6 + -1;
  if (uVar4 < uVar1) {
    iVar5 = (int)uVar4;
  }
  pTVar2 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->type = pTVar2[iVar5].type;
  (__return_storage_ptr__->source)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->source).field_2;
  _Var3._M_p = pTVar2[iVar5].source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->source,_Var3._M_p,
             _Var3._M_p + pTVar2[iVar5].source._M_string_length);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token next(vector<Token> input, int index) {
	return input[nextIndex(input, index)];
}